

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgvalfmt.c
# Opt level: O1

int mpt_msgvalfmt_code(int type)

{
  int iVar1;
  
  iVar1 = -1;
  if (type - 0x62U < 0x18) {
    iVar1 = *(int *)(&DAT_0012028c + (ulong)(type - 0x62U) * 4);
  }
  return iVar1;
}

Assistant:

extern int mpt_msgvalfmt_code(int type)
{
	switch (type) {
#ifdef _MPT_FLOAT_EXTENDED_H
	    case 'e': return MPT_message_value(Float, long double);
#endif
	    case 'd': return MPT_message_value(Float, double);
	    case 'f': return MPT_message_value(Float, float);
	    
	    case 'b': return MPT_message_value(Integer, int8_t);
	    case 'n': return MPT_message_value(Integer, int16_t);
	    case 'i': return MPT_message_value(Integer, int32_t);
	    case 'x': return MPT_message_value(Integer, int64_t);
	    
	    case 'y': return MPT_message_value(Unsigned, uint8_t);
	    case 'q': return MPT_message_value(Unsigned, uint16_t);
	    case 'u': return MPT_message_value(Unsigned, uint32_t);
	    case 't': return MPT_message_value(Unsigned, uint64_t);
	    
	    default:  return -1;
	}
}